

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubdivPatch1IntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  GridSOA *pGVar1;
  GridSOA *pGVar2;
  float *pfVar3;
  GridSOA *pGVar4;
  GridSOA *pGVar5;
  GridSOA *pGVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  size_t sVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  ulong uVar30;
  uint uVar31;
  undefined4 uVar32;
  RTCIntersectArguments *pRVar33;
  GridSOA *pGVar34;
  RTCIntersectArguments *pRVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  GridSOA *pGVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  bool bVar43;
  float fVar44;
  uint uVar45;
  float fVar46;
  uint uVar47;
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  float fVar65;
  undefined1 auVar50 [16];
  float fVar67;
  float fVar68;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar66;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar69;
  undefined1 auVar71 [12];
  undefined1 auVar72 [12];
  float fVar86;
  undefined1 auVar73 [16];
  float fVar70;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar92;
  float fVar107;
  float fVar109;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar93;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar113;
  float fVar118;
  float fVar119;
  float fVar120;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar172;
  float fVar173;
  float fVar177;
  float fVar179;
  undefined1 auVar174 [16];
  float fVar178;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float old_t_1;
  float fStack_b24;
  float fStack_b20;
  float fStack_b1c;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  float old_t;
  undefined1 local_a28 [16];
  NodeRef *local_a10;
  Precalculations *local_a08;
  GridSOA *local_a00;
  ulong local_9f8;
  ulong local_9f0;
  undefined8 local_9e8;
  float fStack_9e0;
  float fStack_9dc;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  ulong local_9b8;
  undefined1 (*local_9b0) [16];
  RTCFilterFunctionNArguments args;
  float local_8c8 [4];
  float local_8b8 [4];
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined4 local_868;
  undefined4 uStack_864;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 local_848;
  undefined4 uStack_844;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  undefined1 local_828 [16];
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar127 [16];
  
  local_a10 = stack + 1;
  stack[0] = root;
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar135 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar144 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar153 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar159 = fVar135 * 0.99999964;
  fVar164 = fVar144 * 0.99999964;
  fVar154 = fVar153 * 0.99999964;
  fVar135 = fVar135 * 1.0000004;
  fVar144 = fVar144 * 1.0000004;
  fVar153 = fVar153 * 1.0000004;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar10 = (tray->tnear).field_0.i[k];
  auVar169._4_4_ = iVar10;
  auVar169._0_4_ = iVar10;
  auVar169._8_4_ = iVar10;
  auVar169._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar174._4_4_ = iVar10;
  auVar174._0_4_ = iVar10;
  auVar174._8_4_ = iVar10;
  auVar174._12_4_ = iVar10;
  local_9b0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar43 = true;
  pRVar35 = (RTCIntersectArguments *)k;
  local_a08 = pre;
  do {
    pRVar33 = (RTCIntersectArguments *)local_a10[-1].ptr;
    local_a10 = local_a10 + -1;
    while (fVar107 = fStack_9e0, ((ulong)pRVar33 & 8) == 0) {
      pfVar3 = (float *)((long)&pRVar33[1].flags + uVar41);
      auVar50._0_4_ = (*pfVar3 - fVar7) * fVar159;
      auVar50._4_4_ = (pfVar3[1] - fVar7) * fVar159;
      auVar50._8_4_ = (pfVar3[2] - fVar7) * fVar159;
      auVar50._12_4_ = (pfVar3[3] - fVar7) * fVar159;
      pfVar3 = (float *)((long)&pRVar33[1].flags + uVar37);
      auVar96._0_4_ = (*pfVar3 - fVar8) * fVar164;
      auVar96._4_4_ = (pfVar3[1] - fVar8) * fVar164;
      auVar96._8_4_ = (pfVar3[2] - fVar8) * fVar164;
      auVar96._12_4_ = (pfVar3[3] - fVar8) * fVar164;
      auVar50 = maxps(auVar50,auVar96);
      pfVar3 = (float *)((long)&pRVar33[1].flags + uVar42);
      auVar100._0_4_ = (*pfVar3 - fVar9) * fVar154;
      auVar100._4_4_ = (pfVar3[1] - fVar9) * fVar154;
      auVar100._8_4_ = (pfVar3[2] - fVar9) * fVar154;
      auVar100._12_4_ = (pfVar3[3] - fVar9) * fVar154;
      auVar73 = maxps(auVar100,auVar169);
      auVar50 = maxps(auVar50,auVar73);
      pfVar3 = (float *)((long)&pRVar33[1].flags + (uVar41 ^ 0x10));
      auVar103._0_4_ = (*pfVar3 - fVar7) * fVar135;
      auVar103._4_4_ = (pfVar3[1] - fVar7) * fVar135;
      auVar103._8_4_ = (pfVar3[2] - fVar7) * fVar135;
      auVar103._12_4_ = (pfVar3[3] - fVar7) * fVar135;
      pfVar3 = (float *)((long)&pRVar33[1].flags + (uVar37 ^ 0x10));
      auVar94._0_4_ = (*pfVar3 - fVar8) * fVar144;
      auVar94._4_4_ = (pfVar3[1] - fVar8) * fVar144;
      auVar94._8_4_ = (pfVar3[2] - fVar8) * fVar144;
      auVar94._12_4_ = (pfVar3[3] - fVar8) * fVar144;
      auVar73 = minps(auVar103,auVar94);
      pfVar3 = (float *)((long)&pRVar33[1].flags + (uVar42 ^ 0x10));
      auVar95._0_4_ = (*pfVar3 - fVar9) * fVar153;
      auVar95._4_4_ = (pfVar3[1] - fVar9) * fVar153;
      auVar95._8_4_ = (pfVar3[2] - fVar9) * fVar153;
      auVar95._12_4_ = (pfVar3[3] - fVar9) * fVar153;
      auVar96 = minps(auVar95,auVar174);
      auVar96 = minps(auVar73,auVar96);
      auVar73._4_4_ = -(uint)(auVar50._4_4_ <= auVar96._4_4_);
      auVar73._0_4_ = -(uint)(auVar50._0_4_ <= auVar96._0_4_);
      auVar73._8_4_ = -(uint)(auVar50._8_4_ <= auVar96._8_4_);
      auVar73._12_4_ = -(uint)(auVar50._12_4_ <= auVar96._12_4_);
      uVar31 = movmskps((int)pRVar35,auVar73);
      pRVar35 = (RTCIntersectArguments *)(ulong)uVar31;
      if (uVar31 == 0) goto LAB_002902ba;
      uVar30 = (ulong)pRVar33 & 0xfffffffffffffff0;
      lVar17 = 0;
      if ((byte)uVar31 != 0) {
        for (; ((byte)uVar31 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
        }
      }
      pRVar33 = *(RTCIntersectArguments **)(uVar30 + lVar17 * 8);
      uVar31 = (uVar31 & 0xff) - 1 & uVar31 & 0xff;
      pRVar35 = pRVar33;
      if (uVar31 != 0) {
        local_a10->ptr = (size_t)pRVar33;
        local_a10 = local_a10 + 1;
        lVar17 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
          }
        }
        pRVar33 = *(RTCIntersectArguments **)(uVar30 + lVar17 * 8);
        uVar31 = uVar31 - 1 & uVar31;
        uVar36 = (ulong)uVar31;
        pRVar35 = pRVar33;
        if (uVar31 != 0) {
          do {
            local_a10->ptr = (size_t)pRVar33;
            local_a10 = local_a10 + 1;
            lVar17 = 0;
            if (uVar36 != 0) {
              for (; (uVar36 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
              }
            }
            pRVar33 = *(RTCIntersectArguments **)(uVar30 + lVar17 * 8);
            uVar36 = uVar36 & uVar36 - 1;
            pRVar35 = pRVar33;
          } while (uVar36 != 0);
        }
      }
    }
    if (((uint)pRVar33 & 0xf) == 8) {
      pGVar34 = (local_a08->super_Precalculations).grid;
      uVar36 = (ulong)*(uint *)(pGVar34 + 0xc);
      uVar30 = (ulong)*(uint *)(pGVar34 + 0x14);
      local_9e8 = pGVar34 + ((ulong)pRVar33 >> 4) * 4 + (ulong)*(uint *)(pGVar34 + 0x24);
      pGVar39 = local_9e8 + uVar30 * 4 + 0x2c;
      pGVar4 = local_9e8 + uVar30 * 8 + 0x2c;
      pGVar5 = pGVar34 + ((ulong)pRVar33 >> 4) * 4 + (ulong)*(uint *)(pGVar34 + 0x24) + 0x2c;
      fVar107 = *(float *)(pGVar5 + 4);
      pGVar6 = local_9e8 + uVar36 * 4 + 0x2c;
      fVar67 = *(float *)(pGVar6 + 4);
      if (uVar36 == 2) {
        fVar69 = *(float *)pGVar39;
        fVar131 = *(float *)(local_9e8 + uVar30 * 4 + 0x30);
        fVar183 = *(float *)(local_9e8 + uVar30 * 4 + 0x34);
        fVar186 = *(float *)(local_9e8 + uVar30 * 4 + 0x38);
        fVar172 = *(float *)pGVar4;
        fVar147 = *(float *)(pGVar4 + 4);
        fVar165 = *(float *)(pGVar4 + 8);
        fVar167 = *(float *)(pGVar4 + 0xc);
        fVar151 = fVar147;
        fVar168 = fVar167;
        fVar68 = fVar67;
        fVar185 = fVar186;
        fVar111 = fVar107;
        fVar134 = fVar131;
      }
      else {
        fVar69 = *(float *)pGVar39;
        fVar131 = *(float *)(local_9e8 + uVar30 * 4 + 0x30);
        pGVar39 = pGVar39 + uVar36 * 4;
        fVar183 = *(float *)pGVar39;
        fVar186 = *(float *)(pGVar39 + 8);
        fVar172 = *(float *)pGVar4;
        fVar147 = *(float *)(pGVar4 + 4);
        pGVar1 = pGVar4 + uVar36 * 4;
        fVar165 = *(float *)pGVar1;
        fVar167 = *(float *)(pGVar1 + 4);
        fVar151 = *(float *)(pGVar4 + 8);
        fVar168 = *(float *)(pGVar1 + 8);
        fVar68 = *(float *)(pGVar6 + 8);
        fVar185 = *(float *)(pGVar39 + 4);
        fVar111 = *(float *)(pGVar5 + 8);
        fVar134 = *(float *)(local_9e8 + uVar30 * 4 + 0x34);
      }
      uVar40 = (ulong)*(uint *)(pGVar34 + 0x10);
      local_a00 = local_9e8 + uVar30 * 0xc + 0x2c;
      fVar11 = *(float *)(ray + k * 4);
      fVar46 = *(float *)(ray + k * 4 + 0x10);
      fVar70 = *(float *)(ray + k * 4 + 0x20);
      fVar12 = *(float *)(ray + k * 4 + 0x40);
      fVar136 = *(float *)pGVar5 - fVar11;
      fVar138 = *(float *)pGVar6 - fVar11;
      fVar140 = fVar107 - fVar11;
      fVar142 = fVar67 - fVar11;
      fVar69 = fVar69 - fVar46;
      fVar86 = fVar183 - fVar46;
      fVar88 = fVar131 - fVar46;
      fVar90 = fVar185 - fVar46;
      fVar172 = fVar172 - fVar70;
      fVar177 = fVar165 - fVar70;
      fVar179 = fVar147 - fVar70;
      fVar181 = fVar167 - fVar70;
      fVar92 = fVar107 - fVar11;
      fVar107 = fVar107 - fVar11;
      fVar109 = fVar111 - fVar11;
      fVar111 = fVar111 - fVar11;
      fVar125 = fVar131 - fVar46;
      fVar131 = fVar131 - fVar46;
      fVar133 = fVar134 - fVar46;
      fVar134 = fVar134 - fVar46;
      fVar145 = fVar147 - fVar70;
      fVar147 = fVar147 - fVar70;
      fVar149 = fVar151 - fVar70;
      fVar151 = fVar151 - fVar70;
      fVar44 = *(float *)pGVar6 - fVar11;
      fVar65 = fVar67 - fVar11;
      fVar67 = fVar67 - fVar11;
      fVar68 = fVar68 - fVar11;
      fVar183 = fVar183 - fVar46;
      fVar184 = fVar185 - fVar46;
      fVar185 = fVar185 - fVar46;
      fVar186 = fVar186 - fVar46;
      fVar165 = fVar165 - fVar70;
      fVar166 = fVar167 - fVar70;
      fVar167 = fVar167 - fVar70;
      fVar168 = fVar168 - fVar70;
      fVar113 = fVar44 - fVar136;
      fVar118 = fVar65 - fVar138;
      fVar119 = fVar67 - fVar140;
      fVar120 = fVar68 - fVar142;
      fVar93 = fVar183 - fVar69;
      fVar108 = fVar184 - fVar86;
      fVar110 = fVar185 - fVar88;
      fVar112 = fVar186 - fVar90;
      fVar121 = fVar165 - fVar172;
      fVar122 = fVar166 - fVar177;
      fVar123 = fVar167 - fVar179;
      fVar124 = fVar168 - fVar181;
      fVar11 = *(float *)(ray + k * 4 + 0x50);
      fVar46 = *(float *)(ray + k * 4 + 0x60);
      fVar70 = fVar136 - fVar92;
      fVar87 = fVar138 - fVar107;
      fVar89 = fVar140 - fVar109;
      fVar91 = fVar142 - fVar111;
      fVar126 = (fVar93 * (fVar165 + fVar172) - (fVar183 + fVar69) * fVar121) * fVar12 +
                ((fVar44 + fVar136) * fVar121 - (fVar165 + fVar172) * fVar113) * fVar11 +
                (fVar113 * (fVar183 + fVar69) - (fVar44 + fVar136) * fVar93) * fVar46;
      fVar132 = (fVar108 * (fVar166 + fVar177) - (fVar184 + fVar86) * fVar122) * fVar12 +
                ((fVar65 + fVar138) * fVar122 - (fVar166 + fVar177) * fVar118) * fVar11 +
                (fVar118 * (fVar184 + fVar86) - (fVar65 + fVar138) * fVar108) * fVar46;
      auVar127._0_8_ = CONCAT44(fVar132,fVar126);
      auVar127._8_4_ =
           (fVar110 * (fVar167 + fVar179) - (fVar185 + fVar88) * fVar123) * fVar12 +
           ((fVar67 + fVar140) * fVar123 - (fVar167 + fVar179) * fVar119) * fVar11 +
           (fVar119 * (fVar185 + fVar88) - (fVar67 + fVar140) * fVar110) * fVar46;
      auVar127._12_4_ =
           (fVar112 * (fVar168 + fVar181) - (fVar186 + fVar90) * fVar124) * fVar12 +
           ((fVar68 + fVar142) * fVar124 - (fVar168 + fVar181) * fVar120) * fVar11 +
           (fVar120 * (fVar186 + fVar90) - (fVar68 + fVar142) * fVar112) * fVar46;
      fVar137 = fVar69 - fVar125;
      fVar139 = fVar86 - fVar131;
      fVar141 = fVar88 - fVar133;
      fVar143 = fVar90 - fVar134;
      fVar146 = fVar172 - fVar145;
      fVar148 = fVar177 - fVar147;
      fVar150 = fVar179 - fVar149;
      fVar152 = fVar181 - fVar151;
      fVar155 = (fVar137 * (fVar172 + fVar145) - (fVar69 + fVar125) * fVar146) * fVar12 +
                ((fVar136 + fVar92) * fVar146 - (fVar172 + fVar145) * fVar70) * fVar11 +
                (fVar70 * (fVar69 + fVar125) - (fVar136 + fVar92) * fVar137) * fVar46;
      fVar156 = (fVar139 * (fVar177 + fVar147) - (fVar86 + fVar131) * fVar148) * fVar12 +
                ((fVar138 + fVar107) * fVar148 - (fVar177 + fVar147) * fVar87) * fVar11 +
                (fVar87 * (fVar86 + fVar131) - (fVar138 + fVar107) * fVar139) * fVar46;
      fVar157 = (fVar141 * (fVar179 + fVar149) - (fVar88 + fVar133) * fVar150) * fVar12 +
                ((fVar140 + fVar109) * fVar150 - (fVar179 + fVar149) * fVar89) * fVar11 +
                (fVar89 * (fVar88 + fVar133) - (fVar140 + fVar109) * fVar141) * fVar46;
      fVar158 = (fVar143 * (fVar181 + fVar151) - (fVar90 + fVar134) * fVar152) * fVar12 +
                ((fVar142 + fVar111) * fVar152 - (fVar181 + fVar151) * fVar91) * fVar11 +
                (fVar91 * (fVar90 + fVar134) - (fVar142 + fVar111) * fVar143) * fVar46;
      fVar173 = fVar92 - fVar44;
      fVar178 = fVar107 - fVar65;
      fVar180 = fVar109 - fVar67;
      fVar182 = fVar111 - fVar68;
      local_9c8 = fVar125 - fVar183;
      fStack_9c4 = fVar131 - fVar184;
      fStack_9c0 = fVar133 - fVar185;
      fStack_9bc = fVar134 - fVar186;
      fVar160 = fVar145 - fVar165;
      fVar161 = fVar147 - fVar166;
      fVar162 = fVar149 - fVar167;
      fVar163 = fVar151 - fVar168;
      auVar74._0_4_ =
           (local_9c8 * (fVar165 + fVar145) - (fVar183 + fVar125) * fVar160) * fVar12 +
           ((fVar44 + fVar92) * fVar160 - (fVar165 + fVar145) * fVar173) * fVar11 +
           (fVar173 * (fVar183 + fVar125) - (fVar44 + fVar92) * local_9c8) * fVar46;
      auVar74._4_4_ =
           (fStack_9c4 * (fVar166 + fVar147) - (fVar184 + fVar131) * fVar161) * fVar12 +
           ((fVar65 + fVar107) * fVar161 - (fVar166 + fVar147) * fVar178) * fVar11 +
           (fVar178 * (fVar184 + fVar131) - (fVar65 + fVar107) * fStack_9c4) * fVar46;
      auVar74._8_4_ =
           (fStack_9c0 * (fVar167 + fVar149) - (fVar185 + fVar133) * fVar162) * fVar12 +
           ((fVar67 + fVar109) * fVar162 - (fVar167 + fVar149) * fVar180) * fVar11 +
           (fVar180 * (fVar185 + fVar133) - (fVar67 + fVar109) * fStack_9c0) * fVar46;
      auVar74._12_4_ =
           (fStack_9bc * (fVar168 + fVar151) - (fVar186 + fVar134) * fVar163) * fVar12 +
           ((fVar68 + fVar111) * fVar163 - (fVar168 + fVar151) * fVar182) * fVar11 +
           (fVar182 * (fVar186 + fVar134) - (fVar68 + fVar111) * fStack_9bc) * fVar46;
      auVar97._0_4_ = fVar126 + fVar155 + auVar74._0_4_;
      auVar97._4_4_ = fVar132 + fVar156 + auVar74._4_4_;
      auVar97._8_4_ = auVar127._8_4_ + fVar157 + auVar74._8_4_;
      auVar97._12_4_ = auVar127._12_4_ + fVar158 + auVar74._12_4_;
      auVar51._8_4_ = auVar127._8_4_;
      auVar51._0_8_ = auVar127._0_8_;
      auVar51._12_4_ = auVar127._12_4_;
      auVar24._4_4_ = fVar156;
      auVar24._0_4_ = fVar155;
      auVar24._8_4_ = fVar157;
      auVar24._12_4_ = fVar158;
      auVar50 = minps(auVar51,auVar24);
      auVar50 = minps(auVar50,auVar74);
      auVar25._4_4_ = fVar156;
      auVar25._0_4_ = fVar155;
      auVar25._8_4_ = fVar157;
      auVar25._12_4_ = fVar158;
      auVar73 = maxps(auVar127,auVar25);
      auVar73 = maxps(auVar73,auVar74);
      local_9d8 = ABS(auVar97._0_4_);
      fStack_9d4 = ABS(auVar97._4_4_);
      fStack_9d0 = ABS(auVar97._8_4_);
      fStack_9cc = ABS(auVar97._12_4_);
      auVar128._4_4_ = -(uint)(auVar73._4_4_ <= fStack_9d4 * 1.1920929e-07);
      auVar128._0_4_ = -(uint)(auVar73._0_4_ <= local_9d8 * 1.1920929e-07);
      auVar128._8_4_ = -(uint)(auVar73._8_4_ <= fStack_9d0 * 1.1920929e-07);
      auVar128._12_4_ = -(uint)(auVar73._12_4_ <= fStack_9cc * 1.1920929e-07);
      auVar52._4_4_ = -(uint)(-(fStack_9d4 * 1.1920929e-07) <= auVar50._4_4_);
      auVar52._0_4_ = -(uint)(-(local_9d8 * 1.1920929e-07) <= auVar50._0_4_);
      auVar52._8_4_ = -(uint)(-(fStack_9d0 * 1.1920929e-07) <= auVar50._8_4_);
      auVar52._12_4_ = -(uint)(-(fStack_9cc * 1.1920929e-07) <= auVar50._12_4_);
      auVar128 = auVar128 | auVar52;
      uVar32 = SUB84(ray,0);
      uVar31 = movmskps(uVar32,auVar128);
      pRVar35 = (RTCIntersectArguments *)(ulong)uVar31;
      if (uVar31 != 0) {
        auVar114._0_4_ = fVar137 * fVar160 - local_9c8 * fVar146;
        auVar114._4_4_ = fVar139 * fVar161 - fStack_9c4 * fVar148;
        auVar114._8_4_ = fVar141 * fVar162 - fStack_9c0 * fVar150;
        auVar114._12_4_ = fVar143 * fVar163 - fStack_9bc * fVar152;
        auVar53._4_4_ = -(uint)(ABS(fVar139 * fVar122) < ABS(fStack_9c4 * fVar148));
        auVar53._0_4_ = -(uint)(ABS(fVar137 * fVar121) < ABS(local_9c8 * fVar146));
        auVar53._8_4_ = -(uint)(ABS(fVar141 * fVar123) < ABS(fStack_9c0 * fVar150));
        auVar53._12_4_ = -(uint)(ABS(fVar143 * fVar124) < ABS(fStack_9bc * fVar152));
        auVar20._4_4_ = fVar108 * fVar148 - fVar139 * fVar122;
        auVar20._0_4_ = fVar93 * fVar146 - fVar137 * fVar121;
        auVar20._8_4_ = fVar110 * fVar150 - fVar141 * fVar123;
        auVar20._12_4_ = fVar112 * fVar152 - fVar143 * fVar124;
        local_898 = blendvps(auVar114,auVar20,auVar53);
        auVar175._0_4_ = fVar173 * fVar146 - fVar70 * fVar160;
        auVar175._4_4_ = fVar178 * fVar148 - fVar87 * fVar161;
        auVar175._8_4_ = fVar180 * fVar150 - fVar89 * fVar162;
        auVar175._12_4_ = fVar182 * fVar152 - fVar91 * fVar163;
        auVar54._4_4_ = -(uint)(ABS(fVar118 * fVar148) < ABS(fVar87 * fVar161));
        auVar54._0_4_ = -(uint)(ABS(fVar113 * fVar146) < ABS(fVar70 * fVar160));
        auVar54._8_4_ = -(uint)(ABS(fVar119 * fVar150) < ABS(fVar89 * fVar162));
        auVar54._12_4_ = -(uint)(ABS(fVar120 * fVar152) < ABS(fVar91 * fVar163));
        auVar18._4_4_ = fVar122 * fVar87 - fVar118 * fVar148;
        auVar18._0_4_ = fVar121 * fVar70 - fVar113 * fVar146;
        auVar18._8_4_ = fVar123 * fVar89 - fVar119 * fVar150;
        auVar18._12_4_ = fVar124 * fVar91 - fVar120 * fVar152;
        local_888 = blendvps(auVar175,auVar18,auVar54);
        auVar170._0_4_ = fVar70 * local_9c8 - fVar173 * fVar137;
        auVar170._4_4_ = fVar87 * fStack_9c4 - fVar178 * fVar139;
        auVar170._8_4_ = fVar89 * fStack_9c0 - fVar180 * fVar141;
        auVar170._12_4_ = fVar91 * fStack_9bc - fVar182 * fVar143;
        auVar55._4_4_ = -(uint)(ABS(fVar87 * fVar108) < ABS(fVar178 * fVar139));
        auVar55._0_4_ = -(uint)(ABS(fVar70 * fVar93) < ABS(fVar173 * fVar137));
        auVar55._8_4_ = -(uint)(ABS(fVar89 * fVar110) < ABS(fVar180 * fVar141));
        auVar55._12_4_ = -(uint)(ABS(fVar91 * fVar112) < ABS(fVar182 * fVar143));
        auVar26._4_4_ = fVar118 * fVar139 - fVar87 * fVar108;
        auVar26._0_4_ = fVar113 * fVar137 - fVar70 * fVar93;
        auVar26._8_4_ = fVar119 * fVar141 - fVar89 * fVar110;
        auVar26._12_4_ = fVar120 * fVar143 - fVar91 * fVar112;
        local_878 = blendvps(auVar170,auVar26,auVar55);
        fVar165 = fVar12 * local_898._0_4_ + fVar11 * local_888._0_4_ + fVar46 * local_878._0_4_;
        fVar167 = fVar12 * local_898._4_4_ + fVar11 * local_888._4_4_ + fVar46 * local_878._4_4_;
        fVar151 = fVar12 * local_898._8_4_ + fVar11 * local_888._8_4_ + fVar46 * local_878._8_4_;
        fVar168 = fVar12 * local_898._12_4_ + fVar11 * local_888._12_4_ + fVar46 * local_878._12_4_;
        fVar165 = fVar165 + fVar165;
        fVar167 = fVar167 + fVar167;
        fVar151 = fVar151 + fVar151;
        fVar168 = fVar168 + fVar168;
        auVar75._0_4_ = fVar172 * local_878._0_4_;
        auVar75._4_4_ = fVar177 * local_878._4_4_;
        auVar75._8_4_ = fVar179 * local_878._8_4_;
        auVar75._12_4_ = fVar181 * local_878._12_4_;
        fVar183 = fVar136 * local_898._0_4_ + fVar69 * local_888._0_4_ + auVar75._0_4_;
        fVar186 = fVar138 * local_898._4_4_ + fVar86 * local_888._4_4_ + auVar75._4_4_;
        fVar172 = fVar140 * local_898._8_4_ + fVar88 * local_888._8_4_ + auVar75._8_4_;
        fVar147 = fVar142 * local_898._12_4_ + fVar90 * local_888._12_4_ + auVar75._12_4_;
        auVar21._4_4_ = fVar167;
        auVar21._0_4_ = fVar165;
        auVar21._8_4_ = fVar151;
        auVar21._12_4_ = fVar168;
        auVar50 = rcpps(auVar75,auVar21);
        fVar107 = auVar50._0_4_;
        fVar67 = auVar50._4_4_;
        fVar69 = auVar50._8_4_;
        fVar131 = auVar50._12_4_;
        local_8a8._0_4_ = ((1.0 - fVar165 * fVar107) * fVar107 + fVar107) * (fVar183 + fVar183);
        local_8a8._4_4_ = ((1.0 - fVar167 * fVar67) * fVar67 + fVar67) * (fVar186 + fVar186);
        local_8a8._8_4_ = ((1.0 - fVar151 * fVar69) * fVar69 + fVar69) * (fVar172 + fVar172);
        local_8a8._12_4_ = ((1.0 - fVar168 * fVar131) * fVar131 + fVar131) * (fVar147 + fVar147);
        fVar107 = *(float *)(ray + k * 4 + 0x80);
        fVar67 = *(float *)(ray + k * 4 + 0x30);
        auVar76._0_4_ =
             -(uint)(local_8a8._0_4_ <= fVar107 && fVar67 <= local_8a8._0_4_) & auVar128._0_4_;
        auVar76._4_4_ =
             -(uint)(local_8a8._4_4_ <= fVar107 && fVar67 <= local_8a8._4_4_) & auVar128._4_4_;
        auVar76._8_4_ =
             -(uint)(local_8a8._8_4_ <= fVar107 && fVar67 <= local_8a8._8_4_) & auVar128._8_4_;
        auVar76._12_4_ =
             -(uint)(local_8a8._12_4_ <= fVar107 && fVar67 <= local_8a8._12_4_) & auVar128._12_4_;
        uVar31 = movmskps(uVar32,auVar76);
        pRVar35 = (RTCIntersectArguments *)(ulong)uVar31;
        if ((uVar31 != 0) &&
           (auVar77._0_4_ = auVar76._0_4_ & -(uint)(fVar165 != 0.0),
           auVar77._4_4_ = auVar76._4_4_ & -(uint)(fVar167 != 0.0),
           auVar77._8_4_ = auVar76._8_4_ & -(uint)(fVar151 != 0.0),
           auVar77._12_4_ = auVar76._12_4_ & -(uint)(fVar168 != 0.0),
           uVar31 = movmskps((int)local_9e8,auVar77), uVar31 != 0)) {
          uStack_b00._0_4_ = *(float *)(pGVar34 + 0x18);
          pRVar35 = (RTCIntersectArguments *)(ulong)(uint)(float)uStack_b00;
          uVar13 = *(undefined4 *)(pGVar34 + 0x1c);
          pGVar14 = (context->scene->geometries).items[(long)pRVar35].ptr;
          if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00290396;
            auVar50 = *(undefined1 (*) [16])local_a00;
            auVar71 = auVar50._0_12_;
            auVar73 = *(undefined1 (*) [16])(local_a00 + uVar36 * 4);
            auVar48 = auVar73._0_12_;
            if (uVar36 == 2) {
              auVar71._0_8_ = auVar50._0_8_;
              auVar71._8_4_ = auVar50._4_4_;
              auVar48._0_8_ = auVar73._0_8_;
              auVar48._8_4_ = auVar73._4_4_;
            }
            auVar50 = rcpps(auVar97,auVar97);
            fVar67 = auVar50._0_4_;
            fVar69 = auVar50._4_4_;
            fVar131 = auVar50._8_4_;
            fVar183 = auVar50._12_4_;
            fVar67 = (float)(-(uint)(1e-18 <= local_9d8) &
                            (uint)(((float)DAT_01f7ba10 - auVar97._0_4_ * fVar67) * fVar67 + fVar67)
                            );
            fVar69 = (float)(-(uint)(1e-18 <= fStack_9d4) &
                            (uint)((DAT_01f7ba10._4_4_ - auVar97._4_4_ * fVar69) * fVar69 + fVar69))
            ;
            fVar131 = (float)(-(uint)(1e-18 <= fStack_9d0) &
                             (uint)((DAT_01f7ba10._8_4_ - auVar97._8_4_ * fVar131) * fVar131 +
                                   fVar131));
            fVar183 = (float)(-(uint)(1e-18 <= fStack_9cc) &
                             (uint)((DAT_01f7ba10._12_4_ - auVar97._12_4_ * fVar183) * fVar183 +
                                   fVar183));
            auVar98._0_4_ = fVar126 * fVar67;
            auVar98._4_4_ = fVar132 * fVar69;
            auVar98._8_4_ = auVar127._8_4_ * fVar131;
            auVar98._12_4_ = auVar127._12_4_ * fVar183;
            auVar96 = minps(auVar98,_DAT_01f7ba10);
            auVar99._0_4_ = fVar155 * fVar67;
            auVar99._4_4_ = fVar156 * fVar69;
            auVar99._8_4_ = fVar157 * fVar131;
            auVar99._12_4_ = fVar158 * fVar183;
            auVar100 = minps(auVar99,_DAT_01f7ba10);
            auVar78._4_4_ = auVar71._4_4_;
            auVar102._0_8_ = auVar71._0_8_;
            auVar78._8_4_ = auVar71._8_4_;
            auVar102._8_4_ = auVar78._4_4_;
            uVar47 = auVar48._4_4_;
            auVar102._12_4_ = uVar47;
            uVar45 = auVar48._0_4_;
            auVar101._8_8_ = auVar102._8_8_;
            auVar101._0_4_ = auVar71._0_4_;
            auVar101._4_4_ = uVar45;
            auVar78._0_4_ = auVar78._4_4_;
            auVar78._12_4_ = auVar78._8_4_;
            auVar56._0_8_ = auVar48._0_8_;
            auVar56._8_4_ = uVar47;
            auVar56._12_4_ = auVar48._8_4_;
            auVar103 = pblendw(auVar101,ZEXT816(0),0xaa);
            auVar73 = pblendw(auVar78,(undefined1  [16])0x0,0xaa);
            auVar50 = pblendw(auVar56,(undefined1  [16])0x0,0xaa);
            local_b18._0_4_ = auVar96._0_4_;
            local_b18._4_4_ = auVar96._4_4_;
            uStack_b10._0_4_ = auVar96._8_4_;
            uStack_b10._4_4_ = auVar96._12_4_;
            old_t_1 = auVar100._0_4_;
            fStack_b24 = auVar100._4_4_;
            fStack_b20 = auVar100._8_4_;
            fStack_b1c = auVar100._12_4_;
            fVar67 = (1.0 - (float)local_b18) - old_t_1;
            fVar69 = (1.0 - local_b18._4_4_) - fStack_b24;
            fVar131 = (1.0 - (float)uStack_b10) - fStack_b20;
            fVar183 = (1.0 - uStack_b10._4_4_) - fStack_b1c;
            local_8c8[0] = (float)auVar103._0_4_ * 0.00012207031 * fVar67 +
                           (float)auVar50._0_4_ * 0.00012207031 * old_t_1 +
                           (float)auVar73._0_4_ * 0.00012207031 * (float)local_b18;
            local_8c8[1] = (float)auVar103._4_4_ * 0.00012207031 * fVar69 +
                           (float)auVar50._4_4_ * 0.00012207031 * fStack_b24 +
                           (float)auVar73._4_4_ * 0.00012207031 * local_b18._4_4_;
            local_8c8[2] = (float)auVar103._8_4_ * 0.00012207031 * fVar131 +
                           (float)auVar50._8_4_ * 0.00012207031 * fStack_b20 +
                           (float)auVar73._8_4_ * 0.00012207031 * (float)uStack_b10;
            local_8c8[3] = (float)auVar103._12_4_ * 0.00012207031 * fVar183 +
                           (float)auVar50._12_4_ * 0.00012207031 * fStack_b1c +
                           (float)auVar73._12_4_ * 0.00012207031 * uStack_b10._4_4_;
            local_8b8[0] = fVar67 * (float)(auVar101._0_4_ >> 0x10) * 0.00012207031 +
                           (float)(uVar45 >> 0x10) * 0.00012207031 * old_t_1 +
                           (float)(auVar78._4_4_ >> 0x10) * 0.00012207031 * (float)local_b18;
            local_8b8[1] = fVar69 * (float)(uVar45 >> 0x10) * 0.00012207031 +
                           (float)(uVar47 >> 0x10) * 0.00012207031 * fStack_b24 +
                           (float)(auVar78._4_4_ >> 0x10) * 0.00012207031 * local_b18._4_4_;
            local_8b8[2] = fVar131 * (float)(auVar78._4_4_ >> 0x10) * 0.00012207031 +
                           (float)(uVar47 >> 0x10) * 0.00012207031 * fStack_b20 +
                           (float)(auVar78._8_4_ >> 0x10) * 0.00012207031 * (float)uStack_b10;
            local_8b8[3] = fVar183 * (float)(uVar47 >> 0x10) * 0.00012207031 +
                           (float)(auVar48._8_4_ >> 0x10) * 0.00012207031 * fStack_b1c +
                           (float)(auVar78._8_4_ >> 0x10) * 0.00012207031 * uStack_b10._4_4_;
            uVar30 = (ulong)(uVar31 & 0xff);
            pRVar35 = (RTCIntersectArguments *)0x0;
            if (uVar30 != 0) {
              for (; ((uVar31 & 0xff) >> (long)pRVar35 & 1) == 0;
                  pRVar35 = (RTCIntersectArguments *)((long)&pRVar35->flags + 1)) {
              }
            }
            local_b08 = CONCAT44((float)uStack_b00,(float)uStack_b00);
            uStack_b00._4_4_ = (float)uStack_b00;
            local_b18 = CONCAT44(uVar13,uVar13);
            uStack_b10._0_4_ = (float)uVar13;
            uStack_b10._4_4_ = (float)uVar13;
            auVar50 = *local_9b0;
            local_9f8 = uVar36;
            local_9f0 = uVar40;
            local_9b8 = uVar40;
            do {
              local_838 = local_8c8[(long)pRVar35];
              fVar67 = local_8b8[(long)pRVar35];
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + (long)pRVar35 * 4);
              args.context = context->user;
              local_828._4_4_ = fVar67;
              local_828._0_4_ = fVar67;
              local_828._8_4_ = fVar67;
              local_828._12_4_ = fVar67;
              local_868 = *(undefined4 *)(local_898 + (long)pRVar35 * 4);
              local_858 = *(undefined4 *)(local_888 + (long)pRVar35 * 4);
              local_848 = *(undefined4 *)(local_878 + (long)pRVar35 * 4);
              uStack_864 = local_868;
              uStack_860 = local_868;
              uStack_85c = local_868;
              uStack_854 = local_858;
              uStack_850 = local_858;
              uStack_84c = local_858;
              uStack_844 = local_848;
              uStack_840 = local_848;
              uStack_83c = local_848;
              fStack_834 = local_838;
              fStack_830 = local_838;
              fStack_82c = local_838;
              local_818 = local_b18;
              uStack_810 = uStack_b10;
              local_808 = local_b08;
              uStack_800 = uStack_b00;
              local_7f8 = (args.context)->instID[0];
              uStack_7f4 = local_7f8;
              uStack_7f0 = local_7f8;
              uStack_7ec = local_7f8;
              local_7e8 = (args.context)->instPrimID[0];
              uStack_7e4 = local_7e8;
              uStack_7e0 = local_7e8;
              uStack_7dc = local_7e8;
              args.valid = (int *)local_a28;
              args.geometryUserPtr = pGVar14->userPtr;
              args.hit = (RTCHitN *)&local_868;
              args.N = 4;
              local_a28 = auVar50;
              args.ray = (RTCRayN *)ray;
              if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar14->occlusionFilterN)(&args);
                uVar40 = local_9b8;
              }
              if (local_a28 == (undefined1  [16])0x0) {
                auVar79._8_4_ = 0xffffffff;
                auVar79._0_8_ = 0xffffffffffffffff;
                auVar79._12_4_ = 0xffffffff;
                auVar79 = auVar79 ^ _DAT_01f7ae20;
              }
              else {
                p_Var15 = context->args->filter;
                if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var15)(&args);
                  uVar40 = local_9b8;
                }
                auVar57._0_4_ = -(uint)(local_a28._0_4_ == 0);
                auVar57._4_4_ = -(uint)(local_a28._4_4_ == 0);
                auVar57._8_4_ = -(uint)(local_a28._8_4_ == 0);
                auVar57._12_4_ = -(uint)(local_a28._12_4_ == 0);
                auVar79 = auVar57 ^ _DAT_01f7ae20;
                auVar73 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar57);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar73;
              }
              if ((_DAT_01f7bb20 & auVar79) != (undefined1  [16])0x0) goto LAB_00290396;
              *(float *)(ray + k * 4 + 0x80) = fVar107;
              uVar30 = uVar30 ^ 1L << ((ulong)pRVar35 & 0x3f);
              pRVar35 = (RTCIntersectArguments *)0x0;
              if (uVar30 != 0) {
                for (; (uVar30 >> (long)pRVar35 & 1) == 0;
                    pRVar35 = (RTCIntersectArguments *)((long)&pRVar35->flags + 1)) {
                }
              }
            } while (uVar30 != 0);
          }
        }
      }
      fVar107 = fStack_9e0;
      if (2 < (uint)uVar40) {
        pGVar34 = local_9e8 + uVar36 * 4 + 0x2c;
        pGVar6 = (local_a08->super_Precalculations).grid;
        uVar30 = (ulong)*(uint *)(pGVar6 + 0x14);
        pGVar39 = pGVar34 + uVar30 * 4;
        pGVar4 = pGVar34 + uVar30 * 8;
        fVar107 = *(float *)(local_9e8 + uVar36 * 4 + 0x30);
        pGVar5 = pGVar34 + uVar36 * 4;
        fVar67 = *(float *)(pGVar5 + 4);
        if (uVar36 == 2) {
          fVar69 = *(float *)pGVar39;
          fVar131 = *(float *)(pGVar39 + 4);
          fVar183 = *(float *)(pGVar39 + 8);
          fVar186 = *(float *)(pGVar39 + 0xc);
          fVar172 = *(float *)pGVar4;
          fVar147 = *(float *)(pGVar4 + 4);
          fVar165 = *(float *)(pGVar4 + 8);
          fVar167 = *(float *)(pGVar4 + 0xc);
          fVar151 = fVar147;
          fVar168 = fVar167;
          fVar68 = fVar67;
          fVar185 = fVar186;
          fVar111 = fVar107;
          fVar134 = fVar131;
        }
        else {
          fVar69 = *(float *)pGVar39;
          fVar131 = *(float *)(pGVar39 + 4);
          pGVar1 = pGVar39 + uVar36 * 4;
          fVar183 = *(float *)pGVar1;
          fVar186 = *(float *)(pGVar1 + 8);
          fVar172 = *(float *)pGVar4;
          fVar147 = *(float *)(pGVar4 + 4);
          pGVar2 = pGVar4 + uVar36 * 4;
          fVar165 = *(float *)pGVar2;
          fVar167 = *(float *)(pGVar2 + 4);
          fVar151 = *(float *)(pGVar4 + 8);
          fVar168 = *(float *)(pGVar2 + 8);
          fVar68 = *(float *)(pGVar5 + 8);
          fVar185 = *(float *)(pGVar1 + 4);
          fVar111 = *(float *)(local_9e8 + uVar36 * 4 + 0x34);
          fVar134 = *(float *)(pGVar39 + 8);
        }
        local_a00 = pGVar34 + uVar30 * 0xc;
        fVar11 = *(float *)(ray + k * 4);
        fVar46 = *(float *)(ray + k * 4 + 0x10);
        fVar70 = *(float *)(ray + k * 4 + 0x20);
        fVar12 = *(float *)(ray + k * 4 + 0x40);
        fVar179 = *(float *)pGVar34 - fVar11;
        fVar180 = *(float *)pGVar5 - fVar11;
        fVar181 = fVar107 - fVar11;
        fVar182 = fVar67 - fVar11;
        fVar69 = fVar69 - fVar46;
        fVar89 = fVar183 - fVar46;
        fVar91 = fVar131 - fVar46;
        fVar93 = fVar185 - fVar46;
        fVar172 = fVar172 - fVar70;
        fVar162 = fVar165 - fVar70;
        fVar166 = fVar147 - fVar70;
        fVar177 = fVar167 - fVar70;
        fVar109 = fVar107 - fVar11;
        fVar107 = fVar107 - fVar11;
        fVar110 = fVar111 - fVar11;
        fVar111 = fVar111 - fVar11;
        fVar133 = fVar131 - fVar46;
        fVar131 = fVar131 - fVar46;
        fVar138 = fVar134 - fVar46;
        fVar134 = fVar134 - fVar46;
        fVar140 = fVar147 - fVar70;
        fVar147 = fVar147 - fVar70;
        fVar143 = fVar151 - fVar70;
        fVar151 = fVar151 - fVar70;
        fVar44 = *(float *)pGVar5 - fVar11;
        fVar65 = fVar67 - fVar11;
        fVar67 = fVar67 - fVar11;
        fVar68 = fVar68 - fVar11;
        fVar183 = fVar183 - fVar46;
        fVar139 = fVar185 - fVar46;
        fVar185 = fVar185 - fVar46;
        fVar186 = fVar186 - fVar46;
        fVar165 = fVar165 - fVar70;
        fVar160 = fVar167 - fVar70;
        fVar167 = fVar167 - fVar70;
        fVar168 = fVar168 - fVar70;
        fVar112 = fVar44 - fVar179;
        fVar113 = fVar65 - fVar180;
        fVar118 = fVar67 - fVar181;
        fVar119 = fVar68 - fVar182;
        local_9c8 = fVar183 - fVar69;
        fStack_9c4 = fVar139 - fVar89;
        fStack_9c0 = fVar185 - fVar91;
        fStack_9bc = fVar186 - fVar93;
        fVar124 = fVar165 - fVar172;
        fVar125 = fVar160 - fVar162;
        fVar126 = fVar167 - fVar166;
        fVar132 = fVar168 - fVar177;
        fStack_9dc = *(float *)(ray + k * 4 + 0x50);
        fVar11 = *(float *)(ray + k * 4 + 0x60);
        fVar88 = fVar179 - fVar109;
        fVar90 = fVar180 - fVar107;
        fVar92 = fVar181 - fVar110;
        fVar108 = fVar182 - fVar111;
        fVar136 = (local_9c8 * (fVar165 + fVar172) - (fVar183 + fVar69) * fVar124) * fVar12 +
                  ((fVar44 + fVar179) * fVar124 - (fVar165 + fVar172) * fVar112) * fStack_9dc +
                  (fVar112 * (fVar183 + fVar69) - (fVar44 + fVar179) * local_9c8) * fVar11;
        fVar137 = (fStack_9c4 * (fVar160 + fVar162) - (fVar139 + fVar89) * fVar125) * fVar12 +
                  ((fVar65 + fVar180) * fVar125 - (fVar160 + fVar162) * fVar113) * fStack_9dc +
                  (fVar113 * (fVar139 + fVar89) - (fVar65 + fVar180) * fStack_9c4) * fVar11;
        auVar129._0_8_ = CONCAT44(fVar137,fVar136);
        auVar129._8_4_ =
             (fStack_9c0 * (fVar167 + fVar166) - (fVar185 + fVar91) * fVar126) * fVar12 +
             ((fVar67 + fVar181) * fVar126 - (fVar167 + fVar166) * fVar118) * fStack_9dc +
             (fVar118 * (fVar185 + fVar91) - (fVar67 + fVar181) * fStack_9c0) * fVar11;
        auVar129._12_4_ =
             (fStack_9bc * (fVar168 + fVar177) - (fVar186 + fVar93) * fVar132) * fVar12 +
             ((fVar68 + fVar182) * fVar132 - (fVar168 + fVar177) * fVar119) * fStack_9dc +
             (fVar119 * (fVar186 + fVar93) - (fVar68 + fVar182) * fStack_9bc) * fVar11;
        fVar46 = fVar69 - fVar133;
        fVar70 = fVar89 - fVar131;
        fVar86 = fVar91 - fVar138;
        fVar87 = fVar93 - fVar134;
        fVar141 = fVar172 - fVar140;
        fVar142 = fVar162 - fVar147;
        fVar145 = fVar166 - fVar143;
        fVar146 = fVar177 - fVar151;
        fVar148 = (fVar46 * (fVar172 + fVar140) - (fVar69 + fVar133) * fVar141) * fVar12 +
                  ((fVar179 + fVar109) * fVar141 - (fVar172 + fVar140) * fVar88) * fStack_9dc +
                  (fVar88 * (fVar69 + fVar133) - (fVar179 + fVar109) * fVar46) * fVar11;
        fVar149 = (fVar70 * (fVar162 + fVar147) - (fVar89 + fVar131) * fVar142) * fVar12 +
                  ((fVar180 + fVar107) * fVar142 - (fVar162 + fVar147) * fVar90) * fStack_9dc +
                  (fVar90 * (fVar89 + fVar131) - (fVar180 + fVar107) * fVar70) * fVar11;
        fVar150 = (fVar86 * (fVar166 + fVar143) - (fVar91 + fVar138) * fVar145) * fVar12 +
                  ((fVar181 + fVar110) * fVar145 - (fVar166 + fVar143) * fVar92) * fStack_9dc +
                  (fVar92 * (fVar91 + fVar138) - (fVar181 + fVar110) * fVar86) * fVar11;
        fVar152 = (fVar87 * (fVar177 + fVar151) - (fVar93 + fVar134) * fVar146) * fVar12 +
                  ((fVar182 + fVar111) * fVar146 - (fVar177 + fVar151) * fVar108) * fStack_9dc +
                  (fVar108 * (fVar93 + fVar134) - (fVar182 + fVar111) * fVar87) * fVar11;
        fVar161 = fVar109 - fVar44;
        fVar163 = fVar107 - fVar65;
        fVar173 = fVar110 - fVar67;
        fVar178 = fVar111 - fVar68;
        fVar120 = fVar133 - fVar183;
        fVar121 = fVar131 - fVar139;
        fVar122 = fVar138 - fVar185;
        fVar123 = fVar134 - fVar186;
        fVar155 = fVar140 - fVar165;
        fVar156 = fVar147 - fVar160;
        fVar157 = fVar143 - fVar167;
        fVar158 = fVar151 - fVar168;
        auVar80._0_4_ =
             (fVar120 * (fVar165 + fVar140) - (fVar183 + fVar133) * fVar155) * fVar12 +
             ((fVar44 + fVar109) * fVar155 - (fVar165 + fVar140) * fVar161) * fStack_9dc +
             (fVar161 * (fVar183 + fVar133) - (fVar44 + fVar109) * fVar120) * fVar11;
        auVar80._4_4_ =
             (fVar121 * (fVar160 + fVar147) - (fVar139 + fVar131) * fVar156) * fVar12 +
             ((fVar65 + fVar107) * fVar156 - (fVar160 + fVar147) * fVar163) * fStack_9dc +
             (fVar163 * (fVar139 + fVar131) - (fVar65 + fVar107) * fVar121) * fVar11;
        auVar80._8_4_ =
             (fVar122 * (fVar167 + fVar143) - (fVar185 + fVar138) * fVar157) * fVar12 +
             ((fVar67 + fVar110) * fVar157 - (fVar167 + fVar143) * fVar173) * fStack_9dc +
             (fVar173 * (fVar185 + fVar138) - (fVar67 + fVar110) * fVar122) * fVar11;
        auVar80._12_4_ =
             (fVar123 * (fVar168 + fVar151) - (fVar186 + fVar134) * fVar158) * fVar12 +
             ((fVar68 + fVar111) * fVar158 - (fVar168 + fVar151) * fVar178) * fStack_9dc +
             (fVar178 * (fVar186 + fVar134) - (fVar68 + fVar111) * fVar123) * fVar11;
        auVar104._0_4_ = fVar136 + fVar148 + auVar80._0_4_;
        auVar104._4_4_ = fVar137 + fVar149 + auVar80._4_4_;
        auVar104._8_4_ = auVar129._8_4_ + fVar150 + auVar80._8_4_;
        auVar104._12_4_ = auVar129._12_4_ + fVar152 + auVar80._12_4_;
        auVar58._8_4_ = auVar129._8_4_;
        auVar58._0_8_ = auVar129._0_8_;
        auVar58._12_4_ = auVar129._12_4_;
        auVar27._4_4_ = fVar149;
        auVar27._0_4_ = fVar148;
        auVar27._8_4_ = fVar150;
        auVar27._12_4_ = fVar152;
        auVar50 = minps(auVar58,auVar27);
        auVar50 = minps(auVar50,auVar80);
        auVar28._4_4_ = fVar149;
        auVar28._0_4_ = fVar148;
        auVar28._8_4_ = fVar150;
        auVar28._12_4_ = fVar152;
        auVar73 = maxps(auVar129,auVar28);
        auVar73 = maxps(auVar73,auVar80);
        fVar107 = ABS(auVar104._0_4_) * 1.1920929e-07;
        fVar67 = ABS(auVar104._4_4_) * 1.1920929e-07;
        fVar131 = ABS(auVar104._8_4_) * 1.1920929e-07;
        fVar183 = ABS(auVar104._12_4_) * 1.1920929e-07;
        auVar130._4_4_ = -(uint)(auVar73._4_4_ <= fVar67);
        auVar130._0_4_ = -(uint)(auVar73._0_4_ <= fVar107);
        auVar130._8_4_ = -(uint)(auVar73._8_4_ <= fVar131);
        auVar130._12_4_ = -(uint)(auVar73._12_4_ <= fVar183);
        auVar59._4_4_ = -(uint)(-fVar67 <= auVar50._4_4_);
        auVar59._0_4_ = -(uint)(-fVar107 <= auVar50._0_4_);
        auVar59._8_4_ = -(uint)(-fVar131 <= auVar50._8_4_);
        auVar59._12_4_ = -(uint)(-fVar183 <= auVar50._12_4_);
        auVar130 = auVar130 | auVar59;
        uVar31 = movmskps(uVar32,auVar130);
        pRVar35 = (RTCIntersectArguments *)(ulong)uVar31;
        fVar107 = fStack_9dc;
        if (uVar31 != 0) {
          auVar115._0_4_ = fVar46 * fVar155 - fVar120 * fVar141;
          auVar115._4_4_ = fVar70 * fVar156 - fVar121 * fVar142;
          auVar115._8_4_ = fVar86 * fVar157 - fVar122 * fVar145;
          auVar115._12_4_ = fVar87 * fVar158 - fVar123 * fVar146;
          auVar60._4_4_ = -(uint)(ABS(fVar70 * fVar125) < ABS(fVar121 * fVar142));
          auVar60._0_4_ = -(uint)(ABS(fVar46 * fVar124) < ABS(fVar120 * fVar141));
          auVar60._8_4_ = -(uint)(ABS(fVar86 * fVar126) < ABS(fVar122 * fVar145));
          auVar60._12_4_ = -(uint)(ABS(fVar87 * fVar132) < ABS(fVar123 * fVar146));
          auVar22._4_4_ = fStack_9c4 * fVar142 - fVar70 * fVar125;
          auVar22._0_4_ = local_9c8 * fVar141 - fVar46 * fVar124;
          auVar22._8_4_ = fStack_9c0 * fVar145 - fVar86 * fVar126;
          auVar22._12_4_ = fStack_9bc * fVar146 - fVar87 * fVar132;
          local_898 = blendvps(auVar115,auVar22,auVar60);
          auVar176._0_4_ = fVar161 * fVar141 - fVar88 * fVar155;
          auVar176._4_4_ = fVar163 * fVar142 - fVar90 * fVar156;
          auVar176._8_4_ = fVar173 * fVar145 - fVar92 * fVar157;
          auVar176._12_4_ = fVar178 * fVar146 - fVar108 * fVar158;
          auVar61._4_4_ = -(uint)(ABS(fVar113 * fVar142) < ABS(fVar90 * fVar156));
          auVar61._0_4_ = -(uint)(ABS(fVar112 * fVar141) < ABS(fVar88 * fVar155));
          auVar61._8_4_ = -(uint)(ABS(fVar118 * fVar145) < ABS(fVar92 * fVar157));
          auVar61._12_4_ = -(uint)(ABS(fVar119 * fVar146) < ABS(fVar108 * fVar158));
          auVar19._4_4_ = fVar125 * fVar90 - fVar113 * fVar142;
          auVar19._0_4_ = fVar124 * fVar88 - fVar112 * fVar141;
          auVar19._8_4_ = fVar126 * fVar92 - fVar118 * fVar145;
          auVar19._12_4_ = fVar132 * fVar108 - fVar119 * fVar146;
          local_888 = blendvps(auVar176,auVar19,auVar61);
          auVar171._0_4_ = fVar88 * fVar120 - fVar161 * fVar46;
          auVar171._4_4_ = fVar90 * fVar121 - fVar163 * fVar70;
          auVar171._8_4_ = fVar92 * fVar122 - fVar173 * fVar86;
          auVar171._12_4_ = fVar108 * fVar123 - fVar178 * fVar87;
          auVar62._4_4_ = -(uint)(ABS(fVar90 * fStack_9c4) < ABS(fVar163 * fVar70));
          auVar62._0_4_ = -(uint)(ABS(fVar88 * local_9c8) < ABS(fVar161 * fVar46));
          auVar62._8_4_ = -(uint)(ABS(fVar92 * fStack_9c0) < ABS(fVar173 * fVar86));
          auVar62._12_4_ = -(uint)(ABS(fVar108 * fStack_9bc) < ABS(fVar178 * fVar87));
          auVar29._4_4_ = fVar113 * fVar70 - fVar90 * fStack_9c4;
          auVar29._0_4_ = fVar112 * fVar46 - fVar88 * local_9c8;
          auVar29._8_4_ = fVar118 * fVar86 - fVar92 * fStack_9c0;
          auVar29._12_4_ = fVar119 * fVar87 - fVar108 * fStack_9bc;
          local_878 = blendvps(auVar171,auVar29,auVar62);
          fVar167 = fVar12 * local_898._0_4_ +
                    fStack_9dc * local_888._0_4_ + fVar11 * local_878._0_4_;
          fVar151 = fVar12 * local_898._4_4_ +
                    fStack_9dc * local_888._4_4_ + fVar11 * local_878._4_4_;
          fVar168 = fVar12 * local_898._8_4_ +
                    fStack_9dc * local_888._8_4_ + fVar11 * local_878._8_4_;
          fVar68 = fVar12 * local_898._12_4_ +
                   fStack_9dc * local_888._12_4_ + fVar11 * local_878._12_4_;
          fVar167 = fVar167 + fVar167;
          fVar151 = fVar151 + fVar151;
          fVar168 = fVar168 + fVar168;
          fVar68 = fVar68 + fVar68;
          auVar81._0_4_ = fVar172 * local_878._0_4_;
          auVar81._4_4_ = fVar162 * local_878._4_4_;
          auVar81._8_4_ = fVar166 * local_878._8_4_;
          auVar81._12_4_ = fVar177 * local_878._12_4_;
          fVar186 = fVar179 * local_898._0_4_ + fVar69 * local_888._0_4_ + auVar81._0_4_;
          fVar172 = fVar180 * local_898._4_4_ + fVar89 * local_888._4_4_ + auVar81._4_4_;
          fVar147 = fVar181 * local_898._8_4_ + fVar91 * local_888._8_4_ + auVar81._8_4_;
          fVar165 = fVar182 * local_898._12_4_ + fVar93 * local_888._12_4_ + auVar81._12_4_;
          auVar23._4_4_ = fVar151;
          auVar23._0_4_ = fVar167;
          auVar23._8_4_ = fVar168;
          auVar23._12_4_ = fVar68;
          auVar50 = rcpps(auVar81,auVar23);
          fVar67 = auVar50._0_4_;
          fVar69 = auVar50._4_4_;
          fVar131 = auVar50._8_4_;
          fVar183 = auVar50._12_4_;
          local_8a8._0_4_ = ((1.0 - fVar167 * fVar67) * fVar67 + fVar67) * (fVar186 + fVar186);
          local_8a8._4_4_ = ((1.0 - fVar151 * fVar69) * fVar69 + fVar69) * (fVar172 + fVar172);
          local_8a8._8_4_ = ((1.0 - fVar168 * fVar131) * fVar131 + fVar131) * (fVar147 + fVar147);
          local_8a8._12_4_ = ((1.0 - fVar68 * fVar183) * fVar183 + fVar183) * (fVar165 + fVar165);
          fVar67 = *(float *)(ray + k * 4 + 0x80);
          fVar69 = *(float *)(ray + k * 4 + 0x30);
          auVar82._0_4_ =
               -(uint)(local_8a8._0_4_ <= fVar67 && fVar69 <= local_8a8._0_4_) & auVar130._0_4_;
          auVar82._4_4_ =
               -(uint)(local_8a8._4_4_ <= fVar67 && fVar69 <= local_8a8._4_4_) & auVar130._4_4_;
          auVar82._8_4_ =
               -(uint)(local_8a8._8_4_ <= fVar67 && fVar69 <= local_8a8._8_4_) & auVar130._8_4_;
          auVar82._12_4_ =
               -(uint)(local_8a8._12_4_ <= fVar67 && fVar69 <= local_8a8._12_4_) & auVar130._12_4_;
          uVar31 = movmskps(uVar32,auVar82);
          pRVar35 = (RTCIntersectArguments *)(ulong)uVar31;
          if ((uVar31 != 0) &&
             (auVar83._0_4_ = auVar82._0_4_ & -(uint)(fVar167 != 0.0),
             auVar83._4_4_ = auVar82._4_4_ & -(uint)(fVar151 != 0.0),
             auVar83._8_4_ = auVar82._8_4_ & -(uint)(fVar168 != 0.0),
             auVar83._12_4_ = auVar82._12_4_ & -(uint)(fVar68 != 0.0),
             uVar31 = movmskps(*(uint *)(pGVar6 + 0x14) * 0xc,auVar83), uVar31 != 0)) {
            uVar45 = *(uint *)(pGVar6 + 0x18);
            pRVar35 = (RTCIntersectArguments *)(ulong)uVar45;
            fStack_9e0 = *(float *)(pGVar6 + 0x1c);
            pGVar14 = (context->scene->geometries).items[(long)pRVar35].ptr;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00290396:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar43;
              }
              local_9d8 = (float)-(uint)(1e-18 <= ABS(auVar104._0_4_));
              fStack_9d4 = (float)-(uint)(1e-18 <= ABS(auVar104._4_4_));
              fStack_9d0 = (float)-(uint)(1e-18 <= ABS(auVar104._8_4_));
              fStack_9cc = (float)-(uint)(1e-18 <= ABS(auVar104._12_4_));
              auVar50 = *(undefined1 (*) [16])local_a00;
              auVar72 = auVar50._0_12_;
              auVar73 = *(undefined1 (*) [16])(local_a00 + uVar36 * 4);
              auVar49 = auVar73._0_12_;
              if (uVar36 == 2) {
                auVar72._0_8_ = auVar50._0_8_;
                auVar72._8_4_ = auVar50._4_4_;
                auVar49._0_8_ = auVar73._0_8_;
                auVar49._8_4_ = auVar73._4_4_;
              }
              auVar50 = rcpps(auVar104,auVar104);
              fVar107 = auVar50._0_4_;
              fVar69 = auVar50._4_4_;
              fVar131 = auVar50._8_4_;
              fVar183 = auVar50._12_4_;
              fVar107 = (float)((uint)local_9d8 &
                               (uint)(((float)DAT_01f7ba10 - auVar104._0_4_ * fVar107) * fVar107 +
                                     fVar107));
              fVar69 = (float)((uint)fStack_9d4 &
                              (uint)((DAT_01f7ba10._4_4_ - auVar104._4_4_ * fVar69) * fVar69 +
                                    fVar69));
              fVar131 = (float)((uint)fStack_9d0 &
                               (uint)((DAT_01f7ba10._8_4_ - auVar104._8_4_ * fVar131) * fVar131 +
                                     fVar131));
              fVar183 = (float)((uint)fStack_9cc &
                               (uint)((DAT_01f7ba10._12_4_ - auVar104._12_4_ * fVar183) * fVar183 +
                                     fVar183));
              auVar116._0_4_ = fVar136 * fVar107;
              auVar116._4_4_ = fVar137 * fVar69;
              auVar116._8_4_ = auVar129._8_4_ * fVar131;
              auVar116._12_4_ = auVar129._12_4_ * fVar183;
              auVar100 = minps(auVar116,_DAT_01f7ba10);
              auVar117._0_4_ = fVar148 * fVar107;
              auVar117._4_4_ = fVar149 * fVar69;
              auVar117._8_4_ = fVar150 * fVar131;
              auVar117._12_4_ = fVar152 * fVar183;
              auVar103 = minps(auVar117,_DAT_01f7ba10);
              auVar84._4_4_ = auVar72._4_4_;
              auVar106._0_8_ = auVar72._0_8_;
              auVar84._8_4_ = auVar72._8_4_;
              auVar106._8_4_ = auVar84._4_4_;
              uVar66 = auVar49._4_4_;
              auVar106._12_4_ = uVar66;
              uVar47 = auVar49._0_4_;
              auVar105._8_8_ = auVar106._8_8_;
              auVar105._0_4_ = auVar72._0_4_;
              auVar105._4_4_ = uVar47;
              auVar84._0_4_ = auVar84._4_4_;
              auVar84._12_4_ = auVar84._8_4_;
              auVar63._0_8_ = auVar49._0_8_;
              auVar63._8_4_ = uVar66;
              auVar63._12_4_ = auVar49._8_4_;
              auVar96 = pblendw(auVar105,ZEXT816(0),0xaa);
              auVar73 = pblendw(auVar84,(undefined1  [16])0x0,0xaa);
              auVar50 = pblendw(auVar63,(undefined1  [16])0x0,0xaa);
              local_b38 = auVar100._0_4_;
              fStack_b34 = auVar100._4_4_;
              fStack_b30 = auVar100._8_4_;
              fStack_b2c = auVar100._12_4_;
              local_b08._0_4_ = auVar103._0_4_;
              local_b08._4_4_ = auVar103._4_4_;
              uStack_b00._0_4_ = auVar103._8_4_;
              uStack_b00._4_4_ = auVar103._12_4_;
              fVar107 = (1.0 - local_b38) - (float)local_b08;
              fVar69 = (1.0 - fStack_b34) - local_b08._4_4_;
              fVar131 = (1.0 - fStack_b30) - (float)uStack_b00;
              fVar183 = (1.0 - fStack_b2c) - uStack_b00._4_4_;
              local_8c8[0] = (float)auVar96._0_4_ * 0.00012207031 * fVar107 +
                             (float)auVar50._0_4_ * 0.00012207031 * (float)local_b08 +
                             (float)auVar73._0_4_ * 0.00012207031 * local_b38;
              local_8c8[1] = (float)auVar96._4_4_ * 0.00012207031 * fVar69 +
                             (float)auVar50._4_4_ * 0.00012207031 * local_b08._4_4_ +
                             (float)auVar73._4_4_ * 0.00012207031 * fStack_b34;
              local_8c8[2] = (float)auVar96._8_4_ * 0.00012207031 * fVar131 +
                             (float)auVar50._8_4_ * 0.00012207031 * (float)uStack_b00 +
                             (float)auVar73._8_4_ * 0.00012207031 * fStack_b30;
              local_8c8[3] = (float)auVar96._12_4_ * 0.00012207031 * fVar183 +
                             (float)auVar50._12_4_ * 0.00012207031 * uStack_b00._4_4_ +
                             (float)auVar73._12_4_ * 0.00012207031 * fStack_b2c;
              local_8b8[0] = fVar107 * (float)(auVar105._0_4_ >> 0x10) * 0.00012207031 +
                             (float)(uVar47 >> 0x10) * 0.00012207031 * (float)local_b08 +
                             (float)(auVar84._4_4_ >> 0x10) * 0.00012207031 * local_b38;
              local_8b8[1] = fVar69 * (float)(uVar47 >> 0x10) * 0.00012207031 +
                             (float)(uVar66 >> 0x10) * 0.00012207031 * local_b08._4_4_ +
                             (float)(auVar84._4_4_ >> 0x10) * 0.00012207031 * fStack_b34;
              local_8b8[2] = fVar131 * (float)(auVar84._4_4_ >> 0x10) * 0.00012207031 +
                             (float)(uVar66 >> 0x10) * 0.00012207031 * (float)uStack_b00 +
                             (float)(auVar84._8_4_ >> 0x10) * 0.00012207031 * fStack_b30;
              local_8b8[3] = fVar183 * (float)(uVar66 >> 0x10) * 0.00012207031 +
                             (float)(auVar49._8_4_ >> 0x10) * 0.00012207031 * uStack_b00._4_4_ +
                             (float)(auVar84._8_4_ >> 0x10) * 0.00012207031 * fStack_b2c;
              uVar38 = (ulong)(uVar31 & 0xff);
              uVar30 = 0;
              if (uVar38 != 0) {
                for (; ((uVar31 & 0xff) >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                }
              }
              local_b08 = CONCAT44(uVar45,uVar45);
              uStack_b00._0_4_ = (float)uVar45;
              uStack_b00._4_4_ = (float)uVar45;
              local_9e8 = (GridSOA *)CONCAT44(fStack_9e0,fStack_9e0);
              auVar50 = *local_9b0;
              local_9f8 = uVar36;
              local_9f0 = uVar40;
              fStack_9dc = fStack_9e0;
              do {
                local_838 = local_8c8[uVar30];
                fVar107 = local_8b8[uVar30];
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a8 + uVar30 * 4);
                args.context = context->user;
                local_828._4_4_ = fVar107;
                local_828._0_4_ = fVar107;
                local_828._8_4_ = fVar107;
                local_828._12_4_ = fVar107;
                local_868 = *(undefined4 *)(local_898 + uVar30 * 4);
                local_858 = *(undefined4 *)(local_888 + uVar30 * 4);
                local_848 = *(undefined4 *)(local_878 + uVar30 * 4);
                uStack_864 = local_868;
                uStack_860 = local_868;
                uStack_85c = local_868;
                uStack_854 = local_858;
                uStack_850 = local_858;
                uStack_84c = local_858;
                uStack_844 = local_848;
                uStack_840 = local_848;
                uStack_83c = local_848;
                fStack_834 = local_838;
                fStack_830 = local_838;
                fStack_82c = local_838;
                local_818 = local_9e8;
                uStack_810 = CONCAT44(fStack_9dc,fStack_9e0);
                local_808 = local_b08;
                uStack_800 = uStack_b00;
                local_7f8 = (args.context)->instID[0];
                uStack_7f4 = local_7f8;
                uStack_7f0 = local_7f8;
                uStack_7ec = local_7f8;
                local_7e8 = (args.context)->instPrimID[0];
                uStack_7e4 = local_7e8;
                uStack_7e0 = local_7e8;
                uStack_7dc = local_7e8;
                args.valid = (int *)local_a28;
                pRVar35 = (RTCIntersectArguments *)pGVar14->userPtr;
                args.hit = (RTCHitN *)&local_868;
                args.N = 4;
                local_a28 = auVar50;
                args.geometryUserPtr = pRVar35;
                args.ray = (RTCRayN *)ray;
                if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar14->occlusionFilterN)(&args);
                }
                if (local_a28 == (undefined1  [16])0x0) {
                  auVar85._8_4_ = 0xffffffff;
                  auVar85._0_8_ = 0xffffffffffffffff;
                  auVar85._12_4_ = 0xffffffff;
                  auVar85 = auVar85 ^ _DAT_01f7ae20;
                }
                else {
                  pRVar35 = context->args;
                  if ((pRVar35->filter != (RTCFilterFunctionN)0x0) &&
                     (((pRVar35->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar14->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*pRVar35->filter)(&args);
                  }
                  auVar64._0_4_ = -(uint)(local_a28._0_4_ == 0);
                  auVar64._4_4_ = -(uint)(local_a28._4_4_ == 0);
                  auVar64._8_4_ = -(uint)(local_a28._8_4_ == 0);
                  auVar64._12_4_ = -(uint)(local_a28._12_4_ == 0);
                  auVar85 = auVar64 ^ _DAT_01f7ae20;
                  auVar73 = blendvps(_DAT_01f7aa00,*(undefined1 (*) [16])(args.ray + 0x80),auVar64);
                  *(undefined1 (*) [16])(args.ray + 0x80) = auVar73;
                }
                if ((_DAT_01f7bb20 & auVar85) != (undefined1  [16])0x0) goto LAB_00290396;
                *(float *)(ray + k * 4 + 0x80) = fVar67;
                uVar38 = uVar38 ^ 1L << (uVar30 & 0x3f);
                uVar30 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                fVar107 = fStack_9e0;
              } while (uVar38 != 0);
            }
          }
        }
      }
    }
    else {
      pRVar35 = (RTCIntersectArguments *)((ulong)pRVar33 & 0xfffffffffffffff0);
      sVar16 = *(size_t *)
                ((long)&pRVar35[1].filter + (ulong)*(uint *)((long)&pRVar35[1].context + 4));
      (local_a08->super_Precalculations).grid = (GridSOA *)pRVar35;
      if (sVar16 != 0) {
        local_a10->ptr = sVar16;
        local_a10 = local_a10 + 1;
      }
    }
LAB_002902ba:
    fStack_9e0 = fVar107;
    bVar43 = local_a10 != stack;
    if (!bVar43) {
      return bVar43;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }